

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void likeFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  sqlite3_context *pCtx;
  int iVar1;
  compareInfo *pInfo_00;
  compareInfo *pInfo;
  uchar *zEsc;
  sqlite3 *db;
  int nPat;
  u32 escape;
  uchar *zB;
  uchar *zA;
  sqlite3_value **argv_local;
  sqlite3_context *psStack_10;
  int argc_local;
  sqlite3_context *context_local;
  
  db._4_4_ = 0;
  zA = (uchar *)argv;
  argv_local._4_4_ = argc;
  psStack_10 = context;
  zEsc = (uchar *)sqlite3_context_db_handle(context);
  _nPat = sqlite3_value_text(*(sqlite3_value **)zA);
  zB = sqlite3_value_text(*(sqlite3_value **)(zA + 8));
  db._0_4_ = sqlite3_value_bytes(*(sqlite3_value **)zA);
  if (*(int *)(zEsc + 0x88) < (int)db) {
    sqlite3_result_error(psStack_10,"LIKE or GLOB pattern too complex",-1);
    return;
  }
  if (argv_local._4_4_ == 3) {
    pInfo = (compareInfo *)sqlite3_value_text(*(sqlite3_value **)(zA + 0x10));
    if (pInfo == (compareInfo *)0x0) {
      return;
    }
    iVar1 = sqlite3Utf8CharLen((char *)pInfo,-1);
    if (iVar1 != 1) {
      sqlite3_result_error(psStack_10,"ESCAPE expression must be a single character",-1);
      return;
    }
    db._4_4_ = sqlite3Utf8Read((uchar **)&pInfo);
  }
  if ((zB != (uchar *)0x0) && (_nPat != (uchar *)0x0)) {
    pInfo_00 = (compareInfo *)sqlite3_user_data(psStack_10);
    pCtx = psStack_10;
    iVar1 = patternCompare(_nPat,zB,pInfo_00,db._4_4_);
    sqlite3_result_int(pCtx,iVar1);
  }
  return;
}

Assistant:

static void likeFunc(
  sqlite3_context *context, 
  int argc, 
  sqlite3_value **argv
){
  const unsigned char *zA, *zB;
  u32 escape = 0;
  int nPat;
  sqlite3 *db = sqlite3_context_db_handle(context);

  zB = sqlite3_value_text(argv[0]);
  zA = sqlite3_value_text(argv[1]);

  /* Limit the length of the LIKE or GLOB pattern to avoid problems
  ** of deep recursion and N*N behavior in patternCompare().
  */
  nPat = sqlite3_value_bytes(argv[0]);
  testcase( nPat==db->aLimit[SQLITE_LIMIT_LIKE_PATTERN_LENGTH] );
  testcase( nPat==db->aLimit[SQLITE_LIMIT_LIKE_PATTERN_LENGTH]+1 );
  if( nPat > db->aLimit[SQLITE_LIMIT_LIKE_PATTERN_LENGTH] ){
    sqlite3_result_error(context, "LIKE or GLOB pattern too complex", -1);
    return;
  }
  assert( zB==sqlite3_value_text(argv[0]) );  /* Encoding did not change */

  if( argc==3 ){
    /* The escape character string must consist of a single UTF-8 character.
    ** Otherwise, return an error.
    */
    const unsigned char *zEsc = sqlite3_value_text(argv[2]);
    if( zEsc==0 ) return;
    if( sqlite3Utf8CharLen((char*)zEsc, -1)!=1 ){
      sqlite3_result_error(context, 
          "ESCAPE expression must be a single character", -1);
      return;
    }
    escape = sqlite3Utf8Read(&zEsc);
  }
  if( zA && zB ){
    struct compareInfo *pInfo = sqlite3_user_data(context);
#ifdef SQLITE_TEST
    sqlite3_like_count++;
#endif
    
    sqlite3_result_int(context, patternCompare(zB, zA, pInfo, escape));
  }
}